

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int read_mdef(char *moddeffn,model_def_t **out_mdef,uint32 *out_gau_begin,int32 *cb2mllr)

{
  uint32 uVar1;
  model_def_t *pmVar2;
  int32 iVar3;
  int extraout_EAX;
  ulong uVar4;
  
  if (moddeffn == (char *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
            ,0x78,"-moddeffn is not given.\n");
  }
  else {
    iVar3 = model_def_read(out_mdef,moddeffn);
    if (iVar3 == 0) {
      if (cb2mllr == (int32 *)0x0) {
        cb2mllr = (int32 *)__ckd_calloc__((ulong)(*out_mdef)->n_total_state,1,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
                                          ,0x7f);
      }
      pmVar2 = *out_mdef;
      uVar1 = pmVar2->n_tied_ci_state;
      *out_gau_begin = uVar1;
      if (uVar1 != 0) {
        uVar4 = 0;
        do {
          cb2mllr[uVar4] = -1;
          uVar4 = uVar4 + 1;
        } while (uVar4 < *out_gau_begin);
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
              ,0x85,"Use CD senones only. (index >= %d)\n",(ulong)pmVar2->n_tied_ci_state);
      return extraout_EAX;
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
            ,0x7b,"Can not read model definition file %s\n",moddeffn);
  }
  exit(1);
}

Assistant:

static int
read_mdef(const char *moddeffn,
	  model_def_t **out_mdef,
	  uint32 *out_gau_begin,
	  int32 *cb2mllr)
{
    uint32 i;

    if (! moddeffn) {
	E_FATAL("-moddeffn is not given.\n");
    }
    else if (model_def_read(out_mdef, moddeffn) != S3_SUCCESS) {
	E_FATAL("Can not read model definition file %s\n", moddeffn);
    }

    if (cb2mllr == NULL)
	cb2mllr = (int32 *)ckd_calloc((*out_mdef)->n_total_state,sizeof(char));
	
    *out_gau_begin = (*out_mdef)->n_tied_ci_state;
    for (i = 0; i < *out_gau_begin; i++) {
	cb2mllr[i] = -1;                    /* skip CI senones */
    }
    E_INFO("Use CD senones only. (index >= %d)\n",(*out_mdef)->n_tied_ci_state);

    return S3_SUCCESS;
}